

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O1

int testValid_Classifier_PredictedFeatureNameAndTarget(void)

{
  int iVar1;
  Rep *pRVar2;
  void *pvVar3;
  string *psVar4;
  pointer pcVar5;
  bool bVar6;
  ModelDescription *pMVar7;
  Type *pTVar8;
  LogMessage *other;
  CategoricalCrossEntropyLossLayer *pCVar9;
  FeatureType *pFVar10;
  ArrayFeatureType *pAVar11;
  StringFeatureType *this;
  ostream *poVar12;
  long lVar13;
  long *plVar14;
  long lVar15;
  NetworkUpdateParameters *pNVar16;
  void **ppvVar17;
  Model spec;
  string target;
  Result res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classLabels;
  TensorAttributes tensorAttributesIn;
  FeatureDescription feature;
  string labels [4];
  Model MStack_1e8;
  string local_1b8;
  vector<long,_std::allocator<long>_> local_198;
  undefined1 local_180 [8];
  _Alloc_hider local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  TensorAttributes local_128;
  undefined1 local_118 [8];
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  LogMessage local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  CoreML::Specification::Model::Model(&MStack_1e8);
  CoreML::Result::Result((Result *)local_180);
  local_128.name._0_4_ = 0x33a845;
  local_128.name._4_4_ = 0;
  local_128.dimension = 3;
  local_128._12_4_ = 0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"1","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"2","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"3","");
  plVar14 = local_48;
  local_58[0] = plVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"4","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__cxx11::string*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_140,
             &local_b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_48 + 2),
             (allocator_type *)&local_f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_158,&local_140);
  local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  buildBasicNeuralNetworkClassifierModel(&MStack_1e8,true,&local_128,&local_158,&local_198,true);
  if (local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  MStack_1e8.specificationversion_ = 4;
  if (MStack_1e8.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar7);
    MStack_1e8.description_ = pMVar7;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&((MStack_1e8.description_)->traininginput_).super_RepeatedPtrFieldBase);
  pMVar7 = MStack_1e8.description_;
  if (MStack_1e8.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  pRVar2 = (pMVar7->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar17 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar17 = (void **)0x0;
  }
  lVar15 = (long)(pMVar7->input_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar15 != 0) {
    lVar13 = 0;
    do {
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)&local_f0,*(FeatureDescription **)((long)ppvVar17 + lVar13));
      if (MStack_1e8.description_ == (ModelDescription *)0x0) {
        pMVar7 = (ModelDescription *)operator_new(0x78);
        CoreML::Specification::ModelDescription::ModelDescription(pMVar7);
        MStack_1e8.description_ = pMVar7;
      }
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&((MStack_1e8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                          (Type *)0x0);
      CoreML::Specification::FeatureDescription::CopyFrom(pTVar8,(FeatureDescription *)&local_f0);
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)&local_f0);
      lVar13 = lVar13 + 8;
    } while (lVar15 * 8 != lVar13);
  }
  if (MStack_1e8.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar7);
    MStack_1e8.description_ = pMVar7;
  }
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((MStack_1e8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  if (MStack_1e8._oneof_case_[0] != 0x193) {
    MStack_1e8.Type_.neuralnetworkclassifier_ =
         CoreML::Specification::NeuralNetworkClassifier::default_instance();
  }
  pNVar16 = (MStack_1e8.Type_.neuralnetworkclassifier_)->updateparams_;
  if (pNVar16 == (NetworkUpdateParameters *)0x0) {
    pNVar16 = (NetworkUpdateParameters *)
              &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
  }
  if ((pNVar16->losslayers_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_f0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_118,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_f0);
  }
  pvVar3 = ((pNVar16->losslayers_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  if (*(int *)((long)pvVar3 + 0x24) == 10) {
    pCVar9 = *(CategoricalCrossEntropyLossLayer **)((long)pvVar3 + 0x18);
  }
  else {
    pCVar9 = CoreML::Specification::CategoricalCrossEntropyLossLayer::default_instance();
  }
  psVar4 = (pCVar9->target_).ptr_;
  pcVar5 = (psVar4->_M_dataplus)._M_p;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar5,pcVar5 + psVar4->_M_string_length);
  psVar4 = (pTVar8->name_).ptr_;
  if (psVar4 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar8->name_,&local_1b8);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar4);
  }
  if (pTVar8->type_ == (FeatureType *)0x0) {
    pFVar10 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar10);
    pTVar8->type_ = pFVar10;
  }
  pFVar10 = pTVar8->type_;
  if (pFVar10->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar10->Type_).multiarraytype_ = pAVar11;
  }
  pAVar11 = (pFVar10->Type_).multiarraytype_;
  pAVar11->datatype_ = 0x20020;
  iVar1 = (pAVar11->shape_).total_size_;
  if ((pAVar11->shape_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar11->shape_,iVar1 + 1);
  }
  iVar1 = (pAVar11->shape_).current_size_;
  (pAVar11->shape_).current_size_ = iVar1 + 1;
  ((pAVar11->shape_).rep_)->elements[iVar1] = 1;
  if (MStack_1e8.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar7);
    MStack_1e8.description_ = pMVar7;
  }
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((MStack_1e8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  pMVar7 = MStack_1e8.description_;
  if (MStack_1e8.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  psVar4 = (pTVar8->name_).ptr_;
  if (psVar4 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&pTVar8->name_,(pMVar7->predictedfeaturename_).ptr_);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar4);
  }
  if (pTVar8->type_ == (FeatureType *)0x0) {
    pFVar10 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar10);
    pTVar8->type_ = pFVar10;
  }
  pFVar10 = pTVar8->type_;
  if (pFVar10->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 3;
    this = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(this);
    (pFVar10->Type_).stringtype_ = this;
  }
  CoreML::Model::validate((Result *)local_118,&MStack_1e8);
  local_180 = local_118;
  std::__cxx11::string::operator=((string *)&local_178,(string *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_p != &local_100) {
    operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
  }
  bVar6 = CoreML::Result::good((Result *)local_180);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x91c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  lVar15 = -0x80;
  do {
    if (plVar14 != (long *)plVar14[-2]) {
      operator_delete((long *)plVar14[-2],*plVar14 + 1);
    }
    plVar14 = plVar14 + -4;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_p != &local_168) {
    operator_delete(local_178._M_p,local_168._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_1e8);
  return (uint)!bVar6;
}

Assistant:

int testValid_Classifier_PredictedFeatureNameAndTarget() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };

    std::string labels[] = { "1", "2", "3", "4" };
    std::vector<std::string> classLabels(labels, labels + sizeof(labels) / sizeof(std::string));

    (void)buildBasicNeuralNetworkClassifierModel(spec, true, &tensorAttributesIn, classLabels, std::vector<int64_t>(), true);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    // Clearing and then specifically adding only the predicted feature name as a training input (for the classifier)
    spec.mutable_description()->clear_traininginput();

    // Re-adding model inputs and the target + predicted feature nmae to classifier's training inputs
    for (auto feature : spec.description().input()) {
        auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInput->CopyFrom(feature);
    }

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    std::string target = spec.neuralnetworkclassifier().updateparams().losslayers(0).categoricalcrossentropylosslayer().target();
    trainingInput->set_name(target);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    auto trainingInput2 = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput2->set_name(spec.description().predictedfeaturename());
    trainingInput2->mutable_type()->mutable_stringtype();

    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);

    return 0;
}